

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb_avx2.c
# Opt level: O3

void av1_txb_init_levels_avx2(tran_low_t *coeff,int width,int height,uint8_t *levels)

{
  uint uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  uint8_t *puVar6;
  long lVar7;
  int iVar8;
  uint8_t *puVar9;
  long lVar10;
  
  uVar1 = height + 4;
  lVar7 = (long)(int)((width + 4) * uVar1);
  puVar9 = levels + lVar7;
  lVar10 = (long)(int)(height * 4 + 0x2fU & 0xffffffe0);
  puVar6 = puVar9 + -lVar10;
  if (puVar9 < puVar6 + 0x20) {
    puVar9 = puVar6 + 0x20;
  }
  memset(puVar6,0,((ulong)(puVar9 + ((~(ulong)levels + lVar10) - lVar7)) & 0xffffffffffffffe0) +
                  0x20);
  if (height == 0x10) {
    puVar9 = levels + 0x10;
    auVar3 = vpmovsxbd_avx2(ZEXT816(0x703060205010400));
    iVar8 = 0;
    do {
      auVar4 = vpackssdw_avx2(*(undefined1 (*) [32])coeff,*(undefined1 (*) [32])((long)coeff + 0x20)
                             );
      auVar5 = vpackssdw_avx2(*(undefined1 (*) [32])((long)coeff + 0x40),
                              *(undefined1 (*) [32])((long)coeff + 0x60));
      auVar4 = vpabsw_avx2(auVar4);
      auVar5 = vpabsw_avx2(auVar5);
      auVar4 = vpacksswb_avx2(auVar4,auVar5);
      auVar4 = vpermd_avx2(auVar3,auVar4);
      *(undefined1 (*) [16])(puVar9 + -0x10) = auVar4._0_16_;
      *(undefined1 (*) [16])(puVar9 + ((ulong)uVar1 - 0x10)) = auVar4._16_16_;
      puVar9[0] = '\0';
      puVar9[1] = '\0';
      puVar9[2] = '\0';
      puVar9[3] = '\0';
      puVar6 = puVar9 + uVar1;
      puVar6[0] = '\0';
      puVar6[1] = '\0';
      puVar6[2] = '\0';
      puVar6[3] = '\0';
      iVar8 = iVar8 + 2;
      puVar9 = puVar9 + 0x28;
      coeff = (tran_low_t *)((long)coeff + 0x80);
    } while (iVar8 < width);
  }
  else if (height == 8) {
    auVar3 = vpmovsxbd_avx2(ZEXT816(0x703060205010400));
    iVar8 = 0;
    do {
      auVar4 = vpackssdw_avx2(*(undefined1 (*) [32])coeff,*(undefined1 (*) [32])((long)coeff + 0x20)
                             );
      auVar5 = vpackssdw_avx2(*(undefined1 (*) [32])((long)coeff + 0x40),
                              *(undefined1 (*) [32])((long)coeff + 0x60));
      auVar4 = vpabsw_avx2(auVar4);
      auVar5 = vpabsw_avx2(auVar5);
      auVar4 = vpacksswb_avx2(auVar4,auVar5);
      auVar4 = vpermd_avx2(auVar3,auVar4);
      *(long *)levels = auVar4._0_8_;
      levels[8] = '\0';
      levels[9] = '\0';
      levels[10] = '\0';
      levels[0xb] = '\0';
      uVar2 = vpextrq_avx(auVar4._0_16_,1);
      *(undefined8 *)(levels + uVar1) = uVar2;
      puVar9 = levels + (ulong)uVar1 + 8;
      puVar9[0] = '\0';
      puVar9[1] = '\0';
      puVar9[2] = '\0';
      puVar9[3] = '\0';
      *(long *)(levels + 0x18) = auVar4._16_8_;
      levels[0x20] = '\0';
      levels[0x21] = '\0';
      levels[0x22] = '\0';
      levels[0x23] = '\0';
      uVar2 = vpextrq_avx(auVar4._16_16_,1);
      *(undefined8 *)(levels + uVar1 * 3) = uVar2;
      puVar9 = levels + (ulong)(uVar1 * 3) + 8;
      puVar9[0] = '\0';
      puVar9[1] = '\0';
      puVar9[2] = '\0';
      puVar9[3] = '\0';
      coeff = (tran_low_t *)((long)coeff + 0x80);
      levels = levels + 0x30;
      iVar8 = iVar8 + 4;
    } while (iVar8 < width);
  }
  else if (height == 4) {
    lVar7 = 0;
    do {
      auVar3 = vpackssdw_avx2(*(undefined1 (*) [32])coeff,*(undefined1 (*) [32])((long)coeff + 0x20)
                             );
      auVar3 = vpabsw_avx2(auVar3);
      auVar3 = vpacksswb_avx2(auVar3,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar3 = vpshufd_avx2(auVar3,0xd8);
      auVar3 = vpermq_avx2(auVar3,0xd8);
      *(undefined1 (*) [32])(levels + lVar7 * 8) = auVar3;
      coeff = (tran_low_t *)((long)coeff + 0x40);
      lVar7 = lVar7 + 4;
    } while ((int)lVar7 < width);
  }
  else {
    iVar8 = 1;
    if (1 < width) {
      iVar8 = width;
    }
    auVar3 = vpmovsxbd_avx2(ZEXT816(0x703060205010400));
    do {
      auVar4 = vpackssdw_avx2(*(undefined1 (*) [32])coeff,*(undefined1 (*) [32])((long)coeff + 0x20)
                             );
      auVar5 = vpackssdw_avx2(*(undefined1 (*) [32])((long)coeff + 0x40),
                              *(undefined1 (*) [32])((long)coeff + 0x60));
      auVar4 = vpabsw_avx2(auVar4);
      auVar5 = vpabsw_avx2(auVar5);
      auVar4 = vpacksswb_avx2(auVar4,auVar5);
      auVar4 = vpermd_avx2(auVar3,auVar4);
      *(undefined1 (*) [32])levels = auVar4;
      *(undefined4 *)(*(undefined1 (*) [32])levels + height) = 0;
      levels = *(undefined1 (*) [32])levels + (int)uVar1;
      coeff = (tran_low_t *)((long)coeff + 0x80);
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  return;
}

Assistant:

void av1_txb_init_levels_avx2(const tran_low_t *const coeff, const int width,
                              const int height, uint8_t *const levels) {
  const int stride = height + TX_PAD_HOR;
  const __m256i y_zeros = _mm256_setzero_si256();

  const int32_t bottom_len = sizeof(*levels) * (TX_PAD_BOTTOM * stride);
  uint8_t *bottom_buf_end = levels + (width + TX_PAD_BOTTOM) * stride;
  uint8_t *bottom_buf = bottom_buf_end - ((bottom_len + 31) & (~31));

  do {
    yy_storeu_256(bottom_buf, y_zeros);
    bottom_buf += 32;
  } while (bottom_buf < bottom_buf_end);

  int i = 0;
  uint8_t *ls = levels;
  const tran_low_t *cf = coeff;
  if (height == 4) {
    do {
      const __m256i c0 = yy_loadu_256(cf);
      const __m256i c1 = yy_loadu_256(cf + 8);
      const __m256i abs01 = _mm256_abs_epi16(_mm256_packs_epi32(c0, c1));
      const __m256i abs01_8 = _mm256_packs_epi16(abs01, y_zeros);
      const __m256i res_ = _mm256_shuffle_epi32(abs01_8, 0xd8);
      const __m256i res = _mm256_permute4x64_epi64(res_, 0xd8);
      yy_storeu_256(ls, res);
      ls += 32;
      cf += 16;
      i += 4;
    } while (i < width);
  } else if (height == 8) {
    do {
      const __m256i coeffA = yy_loadu_256(cf);
      const __m256i coeffB = yy_loadu_256(cf + 8);
      const __m256i coeffC = yy_loadu_256(cf + 16);
      const __m256i coeffD = yy_loadu_256(cf + 24);
      const __m256i coeffAB = _mm256_packs_epi32(coeffA, coeffB);
      const __m256i coeffCD = _mm256_packs_epi32(coeffC, coeffD);
      const __m256i absAB = _mm256_abs_epi16(coeffAB);
      const __m256i absCD = _mm256_abs_epi16(coeffCD);
      const __m256i absABCD = _mm256_packs_epi16(absAB, absCD);
      const __m256i res_ = _mm256_permute4x64_epi64(absABCD, 0xd8);
      const __m256i res = _mm256_shuffle_epi32(res_, 0xd8);
      const __m128i res0 = _mm256_castsi256_si128(res);
      const __m128i res1 = _mm256_extracti128_si256(res, 1);
      xx_storel_64(ls, res0);
      *(int32_t *)(ls + height) = 0;
      xx_storel_64(ls + stride, _mm_srli_si128(res0, 8));
      *(int32_t *)(ls + height + stride) = 0;
      xx_storel_64(ls + stride * 2, res1);
      *(int32_t *)(ls + height + stride * 2) = 0;
      xx_storel_64(ls + stride * 3, _mm_srli_si128(res1, 8));
      *(int32_t *)(ls + height + stride * 3) = 0;
      cf += 32;
      ls += stride << 2;
      i += 4;
    } while (i < width);
  } else if (height == 16) {
    do {
      const __m256i coeffA = yy_loadu_256(cf);
      const __m256i coeffB = yy_loadu_256(cf + 8);
      const __m256i coeffC = yy_loadu_256(cf + 16);
      const __m256i coeffD = yy_loadu_256(cf + 24);
      const __m256i coeffAB = _mm256_packs_epi32(coeffA, coeffB);
      const __m256i coeffCD = _mm256_packs_epi32(coeffC, coeffD);
      const __m256i absAB = _mm256_abs_epi16(coeffAB);
      const __m256i absCD = _mm256_abs_epi16(coeffCD);
      const __m256i absABCD = _mm256_packs_epi16(absAB, absCD);
      const __m256i res_ = _mm256_permute4x64_epi64(absABCD, 0xd8);
      const __m256i res = _mm256_shuffle_epi32(res_, 0xd8);
      xx_storeu_128(ls, _mm256_castsi256_si128(res));
      xx_storeu_128(ls + stride, _mm256_extracti128_si256(res, 1));
      cf += 32;
      *(int32_t *)(ls + height) = 0;
      *(int32_t *)(ls + stride + height) = 0;
      ls += stride << 1;
      i += 2;
    } while (i < width);
  } else {
    do {
      const __m256i coeffA = yy_loadu_256(cf);
      const __m256i coeffB = yy_loadu_256(cf + 8);
      const __m256i coeffC = yy_loadu_256(cf + 16);
      const __m256i coeffD = yy_loadu_256(cf + 24);
      const __m256i coeffAB = _mm256_packs_epi32(coeffA, coeffB);
      const __m256i coeffCD = _mm256_packs_epi32(coeffC, coeffD);
      const __m256i absAB = _mm256_abs_epi16(coeffAB);
      const __m256i absCD = _mm256_abs_epi16(coeffCD);
      const __m256i absABCD = _mm256_packs_epi16(absAB, absCD);
      const __m256i res_ = _mm256_permute4x64_epi64(absABCD, 0xd8);
      const __m256i res = _mm256_shuffle_epi32(res_, 0xd8);
      yy_storeu_256(ls, res);
      cf += 32;
      *(int32_t *)(ls + height) = 0;
      ls += stride;
      i += 1;
    } while (i < width);
  }
}